

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool readFromFile<float,short>
               (string *fname,TWaveformT<short> *res,TTrainKeys *trainKeys,
               int32_t *bufferSize_frames)

{
  int iVar1;
  pointer piVar2;
  iterator __position;
  int offset;
  int iVar3;
  TKey keyPressed;
  ifstream fin;
  int local_240;
  int local_23c;
  long local_238 [4];
  byte abStack_218 [488];
  
  piVar2 = (trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::ifstream::ifstream(local_238,(string *)fname,_S_bin);
  iVar3 = *(int *)(abStack_218 + *(long *)(local_238[0] + -0x18));
  if (iVar3 == 0) {
    *bufferSize_frames = 1;
    std::istream::read((char *)local_238,(long)bufferSize_frames);
    iVar1 = *bufferSize_frames;
    offset = 0;
    local_23c = iVar3;
    while( true ) {
      local_240 = 0;
      std::istream::read((char *)local_238,(long)&local_240);
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
      __position._M_current =
           (trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)trainKeys,__position,&local_240);
      }
      else {
        *__position._M_current = local_240;
        (trainKeys->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      (anonymous_namespace)::readWaveform<float,short>
                ((ifstream *)local_238,res,offset,(long)iVar1 << 0xb);
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
      offset = offset + iVar1 * 0x200;
    }
    std::ifstream::close();
    iVar3 = local_23c;
  }
  std::ifstream::~ifstream(local_238);
  return iVar3 == 0;
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res, TTrainKeys & trainKeys, int32_t & bufferSize_frames) {
    trainKeys.clear();

    std::ifstream fin(fname, std::ios::binary);
    if (fin.good() == false) {
        return false;
    }

    bufferSize_frames = 1;
    fin.read((char *)(&bufferSize_frames), sizeof(bufferSize_frames));

    {
        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        int32_t offset = 0;
        std::streamsize size = bufferSize_frames*kSamplesPerFrame*sizeof(TSampleInput);
        while (true) {
            TKey keyPressed = 0;
            fin.read((char *)(&keyPressed), sizeof(keyPressed));
            if (fin.eof()) break;
            trainKeys.push_back(keyPressed);

            if (readWaveform<TSampleInput>(fin, res, offset, size) == false) {
                return false;
            }

            offset += size/sizeof(TSampleInput);
            if (fin.eof()) break;
        }
    }

    fin.close();

    return true;
}